

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O1

void Centaurus::call_abs<void_const*(*)(void*,int,void_const*),asmjit::X86Gp,int,asmjit::X86Gp>
               (X86Assembler *as,_func_void_ptr_void_ptr_int_void_ptr *addr,X86Gp *args,int args_1,
               X86Gp *args_2)

{
  anon_union_16_7_ed616b9d_for_Operand__0 local_48;
  anon_union_16_7_ed616b9d_for_Operand__0 local_38;
  
  local_48._packed[0].field_10 =
       (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_48._mem.field_2 =
       (args->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  local_38._packed[0].field_10 =
       (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_38._mem.field_2 =
       (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)&local_38._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,args_1);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x263,(Operand_ *)&local_48._any);
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4f0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4e0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x22f,(Operand_ *)(asmjit::x86OpData + 0x4a0));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,(int64_t)addr);
  return;
}

Assistant:

static void call_abs(asmjit::X86Assembler& as, T addr, Ts... args)
{
	push_arg(as, args...);
	if (sizeof...(args) >= 1) as.pop(ARG1_REG);
	if (sizeof...(args) >= 2) as.pop(ARG2_REG);
	if (sizeof...(args) >= 3) as.pop(ARG3_REG);
	if (sizeof...(args) >= 4) as.pop(ARG4_REG);
	
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.sub(asmjit::x86::rsp, 32);
#endif
	as.call(reinterpret_cast<uint64_t>(addr));
#if defined(CENTAURUS_BUILD_WINDOWS)
	as.add(asmjit::x86::rsp, 32);
#endif
}